

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O0

exr_result_t exr_get_chunk_unpacked_size(exr_const_context_t ctxt,int part_index,uint64_t *out)

{
  uint64_t uVar1;
  uint64_t *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  uint64_t sz;
  exr_result_t local_4;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_RDI);
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      local_4 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      uVar1 = in_RDI->parts[(int)in_ESI]->unpacked_size_per_chunk;
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      if (in_RDX == (uint64_t *)0x0) {
        local_4 = (*in_RDI->standard_error)(in_RDI,3);
      }
      else {
        *in_RDX = uVar1;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_chunk_unpacked_size (
    exr_const_context_t ctxt, int part_index, uint64_t* out)
{
    uint64_t sz;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    sz = part->unpacked_size_per_chunk;
    EXR_UNLOCK_WRITE (pctxt);

    if (!out) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);

    *out = sz;
    return EXR_ERR_SUCCESS;
}